

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_utf8_substring_op(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp start,sexp end)

{
  sexp psVar1;
  sexp end_00;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  ulong in_R8;
  ulong in_R9;
  sexp in_stack_fffffffffffffff8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 9)) {
    if ((in_R8 & 1) == 1) {
      end_00 = sexp_string_index_to_cursor
                         ((sexp)n,str,(sexp_sint_t)start,end,in_stack_fffffffffffffff8);
      if (((((ulong)end_00 & 3) != 0) || (psVar1 = end_00, end_00->tag != 0x13)) &&
         (((in_R9 & 1) != 1 ||
          ((psVar1 = sexp_string_index_to_cursor
                               ((sexp)n,str,(sexp_sint_t)start,end,in_stack_fffffffffffffff8),
           ((ulong)psVar1 & 3) != 0 || (psVar1->tag != 0x13)))))) {
        psVar1 = sexp_substring_op(in_stack_fffffffffffffff8,in_RDI,(sexp_sint_t)in_RSI,in_RDX,
                                   in_RCX,end_00);
      }
    }
    else {
      psVar1 = sexp_type_exception(in_RDI,in_RSI,(sexp_uint_t)in_RDX,in_RCX);
    }
  }
  else {
    psVar1 = sexp_type_exception(in_RDI,in_RSI,(sexp_uint_t)in_RDX,in_RCX);
  }
  return psVar1;
}

Assistant:

sexp sexp_utf8_substring_op (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp start, sexp end) {
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, start);
  start = sexp_string_index_to_cursor(ctx, self, n, str, start);
  if (sexp_exceptionp(start)) return start;
  if (sexp_fixnump(end)) {
    end = sexp_string_index_to_cursor(ctx, self, n, str, end);
    if (sexp_exceptionp(end)) return end;
  }
  return sexp_substring_op(ctx, self, n, str, start, end);
}